

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_materialized_cte.hpp
# Opt level: O2

void __thiscall
duckdb::LogicalMaterializedCTE::~LogicalMaterializedCTE(LogicalMaterializedCTE *this)

{
  LogicalCTE::~LogicalCTE(&this->super_LogicalCTE);
  operator_delete(this);
  return;
}

Assistant:

explicit LogicalMaterializedCTE() : LogicalCTE(LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
	}